

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_extract_tri(REF_GRID ref_grid,REF_CELL *ref_cell_ptr)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_STATUS RVar2;
  undefined8 uVar3;
  int cell;
  char *pcVar4;
  REF_INT qua_nodes [27];
  REF_INT aRStack_a8 [30];
  
  ref_node = ref_grid->node;
  uVar1 = ref_cell_deep_copy(ref_cell_ptr,ref_grid->cell[3]);
  if (uVar1 == 0) {
    ref_cell = ref_grid->cell[6];
    if (0 < ref_cell->max) {
      ref_cell_00 = *ref_cell_ptr;
      cell = 0;
      do {
        RVar2 = ref_cell_nodes(ref_cell,cell,aRStack_a8);
        if (RVar2 == 0) {
          uVar1 = ref_shard_add_qua_as_tri(ref_node,ref_cell_00,aRStack_a8);
          if (uVar1 != 0) {
            pcVar4 = "add tri";
            uVar3 = 0x45d;
            goto LAB_001a11eb;
          }
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    uVar1 = 0;
  }
  else {
    pcVar4 = "deep tri copy";
    uVar3 = 0x458;
LAB_001a11eb:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar3,
           "ref_shard_extract_tri",(ulong)uVar1,pcVar4);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_shard_extract_tri(REF_GRID ref_grid,
                                         REF_CELL *ref_cell_ptr) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri, qua;
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  RSS(ref_cell_deep_copy(ref_cell_ptr, ref_grid_tri(ref_grid)),
      "deep tri copy");
  tri = *ref_cell_ptr;
  qua = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    RSS(ref_shard_add_qua_as_tri(ref_node, tri, qua_nodes), "add tri");
  }

  return REF_SUCCESS;
}